

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O0

void __thiscall
bssl::anon_unknown_0::SSLTest_ApplyHandoffRemovesUnsupportedCurves_Test::TestBody
          (SSLTest_ApplyHandoffRemovesUnsupportedCurves_Test *this)

{
  bool bVar1;
  SSL_METHOD *meth;
  pointer psVar2;
  char *pcVar3;
  SSL *__p;
  pointer psVar4;
  pointer pSVar5;
  uint *lhs;
  char *in_R9;
  Span<const_unsigned_char> handoff_00;
  AssertHelper local_240;
  Message local_238;
  size_t local_230;
  uint local_224;
  undefined1 local_220 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_1f0;
  Message local_1e8;
  Span<const_unsigned_char> local_1e0;
  bool local_1c9;
  undefined1 local_1c8 [8];
  AssertionResult gtest_ar__2;
  Message local_1b0;
  size_t local_1a8;
  uint local_19c;
  undefined1 local_198 [8];
  AssertionResult gtest_ar;
  uint8_t handoff [195];
  string local_b8;
  AssertHelper local_98;
  Message local_90;
  undefined1 local_88 [8];
  AssertionResult gtest_ar__1;
  UniquePtr<SSL> server;
  string local_68;
  AssertHelper local_48;
  Message local_40 [3];
  undefined1 local_28 [8];
  AssertionResult gtest_ar_;
  UniquePtr<SSL_CTX> server_ctx;
  SSLTest_ApplyHandoffRemovesUnsupportedCurves_Test *this_local;
  
  meth = (SSL_METHOD *)TLS_method();
  psVar2 = (pointer)SSL_CTX_new(meth);
  std::unique_ptr<ssl_ctx_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<ssl_ctx_st,bssl::internal::Deleter> *)&gtest_ar_.message_,psVar2);
  testing::AssertionResult::AssertionResult<std::unique_ptr<ssl_ctx_st,bssl::internal::Deleter>>
            ((AssertionResult *)local_28,
             (unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&gtest_ar_.message_,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,(internal *)local_28,(AssertionResult *)"server_ctx","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x192a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_48,local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    testing::Message::~Message(local_40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  if (bVar1) {
    psVar2 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                       ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
    __p = SSL_new((SSL_CTX *)psVar2);
    std::unique_ptr<ssl_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<ssl_st,bssl::internal::Deleter> *)&gtest_ar__1.message_,(pointer)__p);
    testing::AssertionResult::AssertionResult<std::unique_ptr<ssl_st,bssl::internal::Deleter>>
              ((AssertionResult *)local_88,
               (unique_ptr<ssl_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
    if (!bVar1) {
      testing::Message::Message(&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_b8,(internal *)local_88,(AssertionResult *)0x4ed771,"false","true",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x192c,pcVar3);
      testing::internal::AssertHelper::operator=(&local_98,&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_98);
      std::__cxx11::string::~string((string *)&local_b8);
      testing::Message::~Message(&local_90);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
    if (bVar1) {
      memcpy(&gtest_ar.message_,&DAT_004d1a40,0xc3);
      local_19c = 0;
      psVar4 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::operator->
                         ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_);
      pSVar5 = std::unique_ptr<bssl::SSL_CONFIG,_bssl::internal::Deleter>::operator->
                         (&psVar4->config);
      local_1a8 = Array<unsigned_short>::size(&pSVar5->supported_group_list);
      lhs = &local_19c;
      testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
                ((EqHelper *)local_198,"0u","server->config->supported_group_list.size()",lhs,
                 &local_1a8);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_198);
      if (!bVar1) {
        testing::Message::Message(&local_1b0);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_198);
        lhs = (uint *)0x1949;
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar__2.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x1949,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2.message_,&local_1b0)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2.message_);
        testing::Message::~Message(&local_1b0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_198);
      psVar4 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                         ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_);
      Span<const_unsigned_char>::Span(&local_1e0,(uchar *)&gtest_ar.message_,0xc3);
      handoff_00.size_ = (size_t)lhs;
      handoff_00.data_ = (uchar *)local_1e0.size_;
      local_1c9 = SSL_apply_handoff((bssl *)psVar4,(SSL *)local_1e0.data_,handoff_00);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_1c8,&local_1c9,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c8);
      if (!bVar1) {
        testing::Message::Message(&local_1e8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar_1.message_,(internal *)local_1c8,
                   (AssertionResult *)
                   "SSL_apply_handoff(server.get(), {handoff, (sizeof(handoff) / sizeof((handoff)[0]))})"
                   ,"false","true",in_R9);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_1f0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x194b,pcVar3);
        testing::internal::AssertHelper::operator=(&local_1f0,&local_1e8);
        testing::internal::AssertHelper::~AssertHelper(&local_1f0);
        std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
        testing::Message::~Message(&local_1e8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c8);
      if (bVar1) {
        local_224 = 1;
        psVar4 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::operator->
                           ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_);
        pSVar5 = std::unique_ptr<bssl::SSL_CONFIG,_bssl::internal::Deleter>::operator->
                           (&psVar4->config);
        local_230 = Array<unsigned_short>::size(&pSVar5->supported_group_list);
        testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
                  ((EqHelper *)local_220,"1u","server->config->supported_group_list.size()",
                   &local_224,&local_230);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_220);
        if (!bVar1) {
          testing::Message::Message(&local_238);
          pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_220);
          testing::internal::AssertHelper::AssertHelper
                    (&local_240,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x194c,pcVar3);
          testing::internal::AssertHelper::operator=(&local_240,&local_238);
          testing::internal::AssertHelper::~AssertHelper(&local_240);
          testing::Message::~Message(&local_238);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_220);
      }
    }
    std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_);
  }
  std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST(SSLTest, ApplyHandoffRemovesUnsupportedCurves) {
  bssl::UniquePtr<SSL_CTX> server_ctx(SSL_CTX_new(TLS_method()));
  ASSERT_TRUE(server_ctx);
  bssl::UniquePtr<SSL> server(SSL_new(server_ctx.get()));
  ASSERT_TRUE(server);

  // handoff is a handoff message that has been artificially modified to pretend
  // that only one ECDH group is supported.  When it is applied to |server|, all
  // groups but that one should be removed.
  //
  // See |ApplyHandoffRemovesUnsupportedCiphers| for how to make a new one of
  // these.
  uint8_t handoff[] = {
      0x30, 0x81, 0xc0, 0x02, 0x01, 0x00, 0x04, 0x00, 0x04, 0x81, 0x82, 0x01,
      0x00, 0x00, 0x7e, 0x03, 0x03, 0x98, 0x30, 0xce, 0xd9, 0xb0, 0xdf, 0x5f,
      0x82, 0x05, 0x4a, 0x43, 0x67, 0x7e, 0xdb, 0x6a, 0x4f, 0x21, 0x18, 0x4e,
      0x0d, 0x94, 0x63, 0x18, 0x8b, 0x54, 0x89, 0xdb, 0x8b, 0x1d, 0x84, 0xbc,
      0x09, 0x00, 0x00, 0x1e, 0xc0, 0x2b, 0xc0, 0x2f, 0xc0, 0x2c, 0xc0, 0x30,
      0xcc, 0xa9, 0xcc, 0xa8, 0xc0, 0x09, 0xc0, 0x13, 0xc0, 0x0a, 0xc0, 0x14,
      0x00, 0x9c, 0x00, 0x9d, 0x00, 0x2f, 0x00, 0x35, 0x00, 0x0a, 0x01, 0x00,
      0x00, 0x37, 0x00, 0x17, 0x00, 0x00, 0xff, 0x01, 0x00, 0x01, 0x00, 0x00,
      0x0a, 0x00, 0x08, 0x00, 0x06, 0x00, 0x1d, 0x00, 0x17, 0x00, 0x18, 0x00,
      0x0b, 0x00, 0x02, 0x01, 0x00, 0x00, 0x23, 0x00, 0x00, 0x00, 0x0d, 0x00,
      0x14, 0x00, 0x12, 0x04, 0x03, 0x08, 0x04, 0x04, 0x01, 0x05, 0x03, 0x08,
      0x05, 0x05, 0x01, 0x08, 0x06, 0x06, 0x01, 0x02, 0x01, 0x04, 0x30, 0x00,
      0x02, 0x00, 0x0a, 0x00, 0x2f, 0x00, 0x35, 0x00, 0x8c, 0x00, 0x8d, 0x00,
      0x9c, 0x00, 0x9d, 0x13, 0x01, 0x13, 0x02, 0x13, 0x03, 0xc0, 0x09, 0xc0,
      0x0a, 0xc0, 0x13, 0xc0, 0x14, 0xc0, 0x2b, 0xc0, 0x2c, 0xc0, 0x2f, 0xc0,
      0x30, 0xc0, 0x35, 0xc0, 0x36, 0xcc, 0xa8, 0xcc, 0xa9, 0xcc, 0xac, 0x04,
      0x02, 0x00, 0x17,
  };

  // The zero length means that the default list of groups is used.
  EXPECT_EQ(0u, server->config->supported_group_list.size());
  ASSERT_TRUE(
      SSL_apply_handoff(server.get(), {handoff, OPENSSL_ARRAY_SIZE(handoff)}));
  EXPECT_EQ(1u, server->config->supported_group_list.size());
}